

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void disturb(player *p)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  
  cmd_cancel_repeat();
  ppVar2 = p->upkeep;
  if (L'\0' < ppVar2->resting || 0xfffc < (ushort)ppVar2->resting) {
    ppVar2->resting = L'\0';
    player_turns_rested = L'\0';
    player_rest_disturb = true;
    ppVar2 = p->upkeep;
    ppVar2->redraw = ppVar2->redraw | 0x8000;
  }
  if (ppVar2->running != L'\0') {
    ppVar2->running = L'\0';
    mem_free(ppVar2->steps);
    p->upkeep->steps = (int16_t *)0x0;
    cmdq_flush();
    event_signal(EVENT_PLAYERMOVED);
    puVar1 = &p->upkeep->update;
    *puVar1 = *puVar1 | 2;
    event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
  }
  event_signal(EVENT_INPUT_FLUSH);
  return;
}

Assistant:

void disturb(struct player *p)
{
	/* Cancel repeated commands */
	cmd_cancel_repeat();

	/* Cancel Resting */
	if (player_is_resting(p)) {
		player_resting_cancel(p, true);
		p->upkeep->redraw |= PR_STATE;
	}

	/* Cancel running */
	if (p->upkeep->running) {
		p->upkeep->running = 0;
		mem_free(p->upkeep->steps);
		p->upkeep->steps = NULL;

		/* Cancel queued commands */
		cmdq_flush();

		/* Check for new panel if appropriate */
		event_signal(EVENT_PLAYERMOVED);
		p->upkeep->update |= PU_TORCH;

		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	/* Flush input */
	event_signal(EVENT_INPUT_FLUSH);
}